

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  undefined1 local_80 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *target;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_40;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_38;
  const_iterator tei;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  string *suffix_local;
  string *config_local;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  tei._M_current = (cmGeneratorTarget **)missingTargets;
  local_40._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(&this->Exports)
  ;
  __gnu_cxx::
  __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
  ::__normal_iterator<cmGeneratorTarget**>
            ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
              *)&local_38,&local_40);
  while( true ) {
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                       (&this->Exports);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&target);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_38);
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppcVar3;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_80);
    TVar2 = cmGeneratorTarget::GetType
                      ((cmGeneratorTarget *)
                       properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (TVar2 != INTERFACE_LIBRARY) {
      SetImportLocationProperty
                (this,config,suffix,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ImportPropertyMap *)local_80);
    }
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_80);
    if (!bVar1) {
      TVar2 = cmGeneratorTarget::GetType
                        ((cmGeneratorTarget *)
                         properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (TVar2 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_80,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)tei._M_current);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_80,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)tei._M_current);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,local_80
                );
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_80);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  for (std::vector<cmGeneratorTarget*>::const_iterator tei =
         this->Exports.begin();
       tei != this->Exports.end(); ++tei) {
    // Collect import properties for this target.
    cmGeneratorTarget* target = *tei;
    ImportPropertyMap properties;

    if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties,
                                        missingTargets);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties, missingTargets);
      }

      // TOOD: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, target, properties);
    }
  }
}